

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O3

void __thiscall HEkkDualRow::setup(HEkkDualRow *this)

{
  setupSlice(this,(this->ekk_instance_->lp_).num_row_ + (this->ekk_instance_->lp_).num_col_);
  this->workNumTotPermutation =
       (this->ekk_instance_->info_).numTotPermutation_.super__Vector_base<int,_std::allocator<int>_>
       ._M_impl.super__Vector_impl_data._M_start;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(this->freeList)._M_t);
  return;
}

Assistant:

void HEkkDualRow::setup() {
  // Setup common vectors
  const HighsInt numTot =
      ekk_instance_.lp_.num_col_ + ekk_instance_.lp_.num_row_;
  setupSlice(numTot);
  workNumTotPermutation = ekk_instance_.info_.numTotPermutation_.data();

  // deleteFreelist() is being called in Phase 1 and Phase 2 since
  // it's in updatePivots(), but create_Freelist() is only called in
  // Phase 2. Hence freeList is not initialised when freeList.empty()
  // is used in deleteFreelist(), clear freeList now.
  freeList.clear();
}